

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O3

int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int iFanin2)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pNode_00;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  void **ppvVar11;
  Hop_Obj_t *pHVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  int local_98;
  timespec ts;
  int pCands [12];
  
  if (p->pPars->fVeryVerbose == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = p->vDivs->nSize < 0x50;
  }
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                  ,0x148,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  if (iFanin2 < -1) {
    __assert_fail("iFanin2 >= 0 || iFanin2 == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                  ,0x149,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  pVVar2 = p->vDivCexes;
  if (0 < pVVar2->nSize) {
    iVar8 = p->nDivWords;
    lVar19 = 0;
    do {
      memset(pVVar2->pArray[lVar19],0xff,(long)iVar8 << 2);
      lVar19 = lVar19 + 1;
    } while (lVar19 < pVVar2->nSize);
  }
  p->nCexes = 0;
  if (bVar6) {
    putchar(10);
    uVar15 = pNode->Id;
    uVar9 = *(uint *)&pNode->field_0x14;
    iVar8 = p->vDivs->nSize;
    uVar1 = (pNode->vFanins).nSize;
    pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[(uint)iFanin]];
    uVar20 = 0;
    if ((pNode_00->vFanouts).nSize == 1) {
      uVar7 = Abc_NodeMffcLabel(pNode_00);
      uVar20 = (ulong)uVar7;
    }
    printf("Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n",
           (ulong)uVar15,(ulong)(uVar9 >> 0xc),(ulong)(iVar8 - uVar1),(ulong)(uint)iFanin,
           (ulong)(uint)iFanin2,(ulong)uVar1,uVar20);
  }
  p->vMfsFanins->nSize = 0;
  iVar8 = (pNode->vFanins).nSize;
  local_98 = 0;
  iVar17 = 0;
  if (0 < iVar8) {
    uVar20 = 0;
    iVar17 = 0;
    do {
      if ((uint)iFanin2 != uVar20 && (uint)iFanin != uVar20) {
        pvVar3 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar20]];
        pVVar2 = p->vMfsFanins;
        uVar15 = pVVar2->nSize;
        if (uVar15 == pVVar2->nCap) {
          if ((int)uVar15 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar11;
            pVVar2->nCap = 0x10;
          }
          else {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar15 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar2->pArray,(ulong)uVar15 << 4);
            }
            pVVar2->pArray = ppvVar11;
            pVVar2->nCap = uVar15 * 2;
          }
        }
        else {
          ppvVar11 = pVVar2->pArray;
        }
        iVar8 = pVVar2->nSize;
        pVVar2->nSize = iVar8 + 1;
        ppvVar11[iVar8] = pvVar3;
        iVar8 = (pNode->vFanins).nSize;
        uVar13 = (uint)(p->vDivs->nSize - iVar8) + uVar20;
        iVar21 = (int)uVar13;
        if ((iVar21 < 0) || (p->vProjVarsSat->nSize <= iVar21)) goto LAB_0044e724;
        lVar19 = (long)iVar17;
        iVar17 = iVar17 + 1;
        pCands[lVar19] = p->vProjVarsSat->pArray[uVar13 & 0xffffffff] * 2 + 1;
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)iVar8);
  }
  iVar8 = Abc_NtkMfsTryResubOnce(p,pCands,iVar17);
  if (iVar8 != -1) {
    if (iVar8 == 1) {
      if (bVar6) {
        printf("Node %d: Fanins %d/%d can be removed.\n",(ulong)(uint)pNode->Id,(ulong)(uint)iFanin,
               (ulong)(uint)iFanin2);
      }
      p->nNodesResub = p->nNodesResub + 1;
      p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        lVar19 = 1;
      }
      else {
        lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      pHVar12 = Abc_NtkMfsInterplate(p,pCands,iVar17);
      if (pHVar12 != (Hop_Obj_t *)0x0) {
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar12);
        iVar8 = clock_gettime(3,(timespec *)&ts);
        if (iVar8 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        lVar14 = lVar14 + lVar19;
LAB_0044e510:
        p->timeInt = p->timeInt + lVar14;
        local_98 = 1;
      }
    }
    else {
      if (bVar6) {
        iVar8 = 0xb;
        do {
          putchar(0x20);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        iVar8 = (pNode->vFanins).nSize;
        if (iVar8 < p->vDivs->nSize) {
          uVar20 = 0;
          do {
            printf("%d",(ulong)(uint)((int)uVar20 + (int)(uVar20 / 10) * -10));
            uVar15 = (int)uVar20 + 1;
            uVar20 = (ulong)uVar15;
            iVar8 = (pNode->vFanins).nSize;
          } while ((int)uVar15 < p->vDivs->nSize - iVar8);
        }
        if (0 < iVar8) {
          iVar21 = 0;
          iVar8 = iFanin;
          do {
            iVar10 = iVar21 + 0x61;
            if (iVar21 == iFanin2) {
              iVar10 = 0x2a;
            }
            bVar22 = iVar8 == 0;
            iVar8 = iVar8 + -1;
            if (bVar22) {
              iVar10 = 0x2a;
            }
            putchar(iVar10);
            iVar21 = iVar21 + 1;
          } while (iVar21 < (pNode->vFanins).nSize);
        }
        putchar(10);
      }
      iVar8 = iVar17 + 2;
      uVar15 = p->nCexes;
      uVar20 = 0xffffffff;
      uVar13 = 0xffffffff;
      do {
        uVar18 = (ulong)uVar15;
        if (bVar6) {
          printf("%3d: %2d %2d ",uVar18,uVar13,uVar20 & 0xffffffff);
          if (0 < p->vDivs->nSize) {
            lVar19 = 0;
            do {
              if (p->vDivCexes->nSize <= lVar19) goto LAB_0044e705;
              uVar15 = p->nCexes - 1;
              printf("%d",(ulong)((*(uint *)((long)p->vDivCexes->pArray[lVar19] +
                                            (long)((int)uVar15 >> 5) * 4) >> (uVar15 & 0x1f) & 1) !=
                                 0));
              lVar19 = lVar19 + 1;
            } while (lVar19 < p->vDivs->nSize);
          }
          putchar(10);
          uVar18 = (ulong)(uint)p->nCexes;
        }
        uVar15 = (((int)uVar18 >> 5) + 1) - (uint)((uVar18 & 0x1f) == 0);
        if (p->nDivWords < (int)uVar15) {
          __assert_fail("nWords <= p->nDivWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                        ,0x195,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
        }
        pVVar2 = p->vDivs;
        iVar21 = pVVar2->nSize;
        iVar10 = (pNode->vFanins).nSize;
        uVar9 = iVar21 - iVar10;
        uVar13 = 1;
        if (1 < (int)uVar9) {
          uVar1 = p->vDivCexes->nSize;
          uVar13 = (ulong)(uint)(iVar21 - iVar10);
          if ((int)uVar1 < 2) {
            uVar1 = 1;
          }
          uVar18 = 1;
          do {
            if (uVar18 == uVar1) goto LAB_0044e705;
            ppvVar11 = p->vDivCexes->pArray;
            iVar10 = p->pPars->fPower;
            if (iVar10 == 0) {
LAB_0044e2cb:
              uVar20 = 0;
              do {
                if (iVar10 == 0) {
LAB_0044e31e:
                  uVar16 = 0;
                  if (0 < (int)uVar15) {
                    while ((*(uint *)((long)ppvVar11[uVar20] + uVar16 * 4) |
                           *(uint *)((long)ppvVar11[uVar18] + uVar16 * 4)) == 0xffffffff) {
                      uVar16 = uVar16 + 1;
                      if (uVar15 == uVar16) goto LAB_0044e365;
                    }
                  }
                  if ((uint)uVar16 == uVar15) {
LAB_0044e365:
                    uVar13 = uVar18 & 0xffffffff;
                    goto LAB_0044e368;
                  }
                }
                else {
                  if ((long)iVar21 <= (long)uVar20) goto LAB_0044e705;
                  pVVar4 = p->vProbs;
                  if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0044e31e;
                  uVar7 = *(uint *)((long)pVVar2->pArray[uVar20] + 0x10);
                  if (pVVar4->nSize <= (int)uVar7) goto LAB_0044e31e;
                  if ((int)uVar7 < 0) goto LAB_0044e724;
                  if ((float)pVVar4->pArray[uVar7] < 0.12) goto LAB_0044e31e;
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar18);
              uVar20 = uVar18 & 0xffffffff;
            }
            else {
              if ((long)iVar21 <= (long)uVar18) goto LAB_0044e705;
              pVVar4 = p->vProbs;
              if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0044e2cb;
              uVar7 = *(uint *)((long)pVVar2->pArray[uVar18] + 0x10);
              if (pVVar4->nSize <= (int)uVar7) goto LAB_0044e2cb;
              if ((int)uVar7 < 0) goto LAB_0044e724;
              if ((float)pVVar4->pArray[uVar7] < 0.12) goto LAB_0044e2cb;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar9);
        }
LAB_0044e368:
        uVar15 = (uint)uVar13;
        if (uVar15 == uVar9) {
          return 0;
        }
        iVar21 = (int)uVar20;
        if ((iVar21 < 0) || (pVVar4 = p->vProjVarsSat, pVVar4->nSize <= iVar21)) {
LAB_0044e724:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        local_98 = 0;
        piVar5 = pVVar4->pArray;
        pCands[iVar17] = piVar5[uVar20 & 0xffffffff] * 2 + 1;
        if (pVVar4->nSize <= (int)uVar15) goto LAB_0044e724;
        pCands[iVar17 + 1] = piVar5[uVar13] * 2 + 1;
        iVar10 = Abc_NtkMfsTryResubOnce(p,pCands,iVar8);
        if (iVar10 == -1) {
          return 0;
        }
        if (iVar10 == 1) {
          if (bVar6) {
            printf("Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n",
                   (ulong)(uint)pNode->Id,(ulong)(uint)iFanin,(ulong)(uint)iFanin2,uVar13,
                   uVar20 & 0xffffffff);
          }
          p->nNodesResub = p->nNodesResub + 1;
          p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
          iVar17 = clock_gettime(3,(timespec *)&ts);
          if (iVar17 < 0) {
            lVar19 = 1;
          }
          else {
            lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          pHVar12 = Abc_NtkMfsInterplate(p,pCands,iVar8);
          if (pHVar12 == (Hop_Obj_t *)0x0) {
            return 0;
          }
          if (iVar21 < p->vDivs->nSize) {
            pVVar2 = p->vMfsFanins;
            pvVar3 = p->vDivs->pArray[uVar20 & 0xffffffff];
            uVar9 = pVVar2->nSize;
            if (uVar9 == pVVar2->nCap) {
              if ((int)uVar9 < 0x10) {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar2->pArray,0x80);
                }
                pVVar2->pArray = ppvVar11;
                pVVar2->nCap = 0x10;
              }
              else {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar9 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar2->pArray,(ulong)uVar9 << 4);
                }
                pVVar2->pArray = ppvVar11;
                pVVar2->nCap = uVar9 * 2;
              }
            }
            else {
              ppvVar11 = pVVar2->pArray;
            }
            iVar17 = pVVar2->nSize;
            pVVar2->nSize = iVar17 + 1;
            ppvVar11[iVar17] = pvVar3;
            if ((int)uVar15 < p->vDivs->nSize) {
              pVVar2 = p->vMfsFanins;
              pvVar3 = p->vDivs->pArray[uVar13];
              uVar15 = pVVar2->nSize;
              if (uVar15 == pVVar2->nCap) {
                if ((int)uVar15 < 0x10) {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar11 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar11 = (void **)realloc(pVVar2->pArray,0x80);
                  }
                  pVVar2->pArray = ppvVar11;
                  pVVar2->nCap = 0x10;
                }
                else {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar11 = (void **)malloc((ulong)uVar15 << 4);
                  }
                  else {
                    ppvVar11 = (void **)realloc(pVVar2->pArray,(ulong)uVar15 << 4);
                  }
                  pVVar2->pArray = ppvVar11;
                  pVVar2->nCap = uVar15 * 2;
                }
              }
              else {
                ppvVar11 = pVVar2->pArray;
              }
              iVar17 = pVVar2->nSize;
              pVVar2->nSize = iVar17 + 1;
              ppvVar11[iVar17] = pvVar3;
              if (p->vMfsFanins->nSize != iVar8) {
                __assert_fail("Vec_PtrSize(p->vMfsFanins) == nCands + 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                              ,0x1d1,
                              "int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
              }
              Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar12);
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar14 = -1;
              }
              else {
                lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              lVar14 = lVar14 + lVar19;
              goto LAB_0044e510;
            }
          }
LAB_0044e705:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar15 = p->nCexes;
      } while ((int)uVar15 < p->pPars->nWinMax);
    }
  }
  return local_98;
}

Assistant:

int Abc_NtkMfsSolveSatResub2( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int iFanin2 )
{
    int fVeryVerbose = p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 80;
    unsigned * pData, * pData2;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, iVar2, i, w, nCands, nWords, fBreak;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    assert( iFanin2 >= 0 || iFanin2 == -1 );

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( fVeryVerbose )
    {
        printf( "\n" );
        printf( "Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            iFanin, iFanin2, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin)) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin || i == iFanin2 )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( fVeryVerbose )
        printf( "Node %d: Fanins %d/%d can be removed.\n", pNode->Id, iFanin, iFanin2 );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        return 1;
    }

    if ( fVeryVerbose )
    {
        for ( i = 0; i < 11; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin || i == iFanin2 )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = iVar2 = -1;
    while ( 1 )
    {
#if 1 // sjang
#endif
        if ( fVeryVerbose )
        {
            printf( "%3d: %2d %2d ", p->nCexes, iVar, iVar2 );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        fBreak = 0;
        for ( iVar = 1; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
#if 1  // sjang
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
                    continue;
            }
#endif
            for ( iVar2 = 0; iVar2 < iVar; iVar2++ )
            {
                pData2 = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar2 );
#if 1 // sjang
	            if ( p->pPars->fPower )
		        {
			        Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar2);
				    // only accept the divisor if it is "cool"
					if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
						continue;
	            }
#endif
                for ( w = 0; w < nWords; w++ )
                    if ( (pData[w] | pData2[w]) != ~0 )
                        break;
                if ( w == nWords )
                {
                    fBreak = 1;
                    break;
                }
            }
            if ( fBreak )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands]   = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar2), 1 );
        pCands[nCands+1] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+2 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( fVeryVerbose )
            printf( "Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n", pNode->Id, iFanin, iFanin2, iVar, iVar2 );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+2 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar2) );
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            assert( Vec_PtrSize(p->vMfsFanins) == nCands + 2 );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    return 0;
}